

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_C2_Req.cpp
# Opt level: O0

bool __thiscall
SRUP_MSG_SYNDICATED_C2_REQ::DeSerialize(SRUP_MSG_SYNDICATED_C2_REQ *this,uint8_t *serial_data)

{
  uint16_t uVar1;
  uint64_t *puVar2;
  uint8_t *puVar3;
  int local_3c;
  uint64_t uStack_38;
  int i_1;
  uint8_t snd_bytes [8];
  int i;
  uint8_t sid_bytes [8];
  uint8_t bytes [2];
  uint32_t p;
  uint16_t x;
  uint8_t *serial_data_local;
  SRUP_MSG_SYNDICATED_C2_REQ *this_local;
  
  *(this->super_SRUP_MSG).m_version = *serial_data;
  *(this->super_SRUP_MSG).m_msgtype = serial_data[1];
  sid_bytes[2] = '\x02';
  sid_bytes[3] = '\0';
  sid_bytes[4] = '\0';
  sid_bytes[5] = '\0';
  snd_bytes[0] = '\0';
  snd_bytes[1] = '\0';
  snd_bytes[2] = '\0';
  snd_bytes[3] = '\0';
  for (; (int)snd_bytes._0_4_ < 8; snd_bytes._0_4_ = snd_bytes._0_4_ + 1) {
    snd_bytes[(long)(int)snd_bytes._0_4_ + 6] = serial_data[(uint)sid_bytes._2_4_];
    sid_bytes._2_4_ = sid_bytes._2_4_ + 1;
  }
  if (((this->super_SRUP_MSG).m_sequence_ID != (uint64_t *)0x0) &&
     (puVar2 = (this->super_SRUP_MSG).m_sequence_ID, puVar2 != (uint64_t *)0x0)) {
    operator_delete(puVar2);
  }
  puVar2 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG).m_sequence_ID = puVar2;
  *(this->super_SRUP_MSG).m_sequence_ID = stack0xffffffffffffffd6;
  for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
    *(uint8_t *)((long)&stack0xffffffffffffffc8 + (long)local_3c) =
         serial_data[(uint)sid_bytes._2_4_];
    sid_bytes._2_4_ = sid_bytes._2_4_ + 1;
  }
  if (((this->super_SRUP_MSG).m_sender_ID != (uint64_t *)0x0) &&
     (puVar2 = (this->super_SRUP_MSG).m_sender_ID, puVar2 != (uint64_t *)0x0)) {
    operator_delete(puVar2);
  }
  puVar2 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG).m_sender_ID = puVar2;
  *(this->super_SRUP_MSG).m_sender_ID = uStack_38;
  sid_bytes._0_2_ = *(undefined2 *)(serial_data + (uint)sid_bytes._2_4_);
  uVar1 = SRUP_MSG::decodeLength(sid_bytes);
  sid_bytes._2_4_ = sid_bytes._2_4_ + 2;
  if (((this->super_SRUP_MSG).m_token != (uint8_t *)0x0) &&
     (puVar3 = (this->super_SRUP_MSG).m_token, puVar3 != (uint8_t *)0x0)) {
    operator_delete__(puVar3);
  }
  puVar3 = (uint8_t *)operator_new__((long)(int)(uVar1 + 1));
  (this->super_SRUP_MSG).m_token = puVar3;
  memcpy((this->super_SRUP_MSG).m_token,serial_data + (uint)sid_bytes._2_4_,(ulong)uVar1);
  (this->super_SRUP_MSG).m_token_len = uVar1;
  sid_bytes._2_4_ = (uint)uVar1 + sid_bytes._2_4_;
  sid_bytes._0_2_ = *(undefined2 *)(serial_data + (uint)sid_bytes._2_4_);
  uVar1 = SRUP_MSG::decodeLength(sid_bytes);
  sid_bytes._2_4_ = sid_bytes._2_4_ + 2;
  (this->super_SRUP_MSG).m_sig_len = uVar1;
  if (((this->super_SRUP_MSG).m_signature != (uint8_t *)0x0) &&
     (puVar3 = (this->super_SRUP_MSG).m_signature, puVar3 != (uint8_t *)0x0)) {
    operator_delete__(puVar3);
  }
  puVar3 = (uint8_t *)operator_new__((ulong)uVar1);
  (this->super_SRUP_MSG).m_signature = puVar3;
  memcpy((this->super_SRUP_MSG).m_signature,serial_data + (uint)sid_bytes._2_4_,(ulong)uVar1);
  sid_bytes._2_4_ = (uint)uVar1 + sid_bytes._2_4_;
  sid_bytes._0_2_ = *(undefined2 *)(serial_data + (uint)sid_bytes._2_4_);
  uVar1 = SRUP_MSG::decodeLength(sid_bytes);
  sid_bytes._2_4_ = sid_bytes._2_4_ + 2;
  if ((this->m_data != (uint8_t *)0x0) && (this->m_data != (uint8_t *)0x0)) {
    operator_delete__(this->m_data);
  }
  puVar3 = (uint8_t *)operator_new__((long)(int)(uVar1 + 1));
  this->m_data = puVar3;
  memcpy(this->m_data,serial_data + (uint)sid_bytes._2_4_,(ulong)uVar1);
  this->m_data_len = uVar1;
  sid_bytes._2_4_ = (uint)uVar1 + sid_bytes._2_4_;
  if (this->m_req_id != (uint8_t *)0x0) {
    operator_delete__(this->m_req_id);
  }
  puVar3 = (uint8_t *)operator_new__(1);
  this->m_req_id = puVar3;
  *this->m_req_id = serial_data[(uint)sid_bytes._2_4_];
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_C2_REQ::DeSerialize (const uint8_t *serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    uint8_t sid_bytes[8];
    for (int i=0;i<8;i++)
    {
        std::memcpy(&sid_bytes[i], (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // Next we have to unmarshall the sender ID...
    uint8_t snd_bytes[8];
    for (int i=0;i<8;i++)
    {
        std::memcpy(&snd_bytes[i], (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the sender ID
    if (m_sender_ID != nullptr)
        delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now we have two-bytes for the size of the token ... and x bytes for the token
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    if(m_token != nullptr)
        delete[] m_token;
    m_token = new uint8_t[x+1];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    m_sig_len = x;

    // The next x bytes are the value of the signature.
    if(m_signature != nullptr)
        delete[] m_signature;
    m_signature = new unsigned char[x];
    std::memcpy(m_signature, serial_data + p, x);

    p+=x;

    // ...and now the data
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    if(m_data != nullptr)
        delete[] m_data;
    m_data = new uint8_t[x+1];
    std::memcpy(m_data, (uint8_t *) serial_data + p, x);
    m_data_len = x;

    p+=x;
    // Lastly we have one byte for the request ID.

    delete[] m_req_id;
    m_req_id = new uint8_t[1];
    std::memcpy(m_req_id, serial_data + p, 1);

    return true;
}